

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

exr_result_t
exr_attr_string_set_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  char *__dest;
  exr_result_t eVar1;
  ulong __n;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (s == (exr_attr_string_t *)0x0) {
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid string argument to string set");
      return eVar1;
    }
    if (len < 0) {
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Received request to assign a negative sized string (%d)",
                         (ulong)(uint)len,ctxt->print_error);
      return eVar1;
    }
    if (s->alloc_size <= len) {
      if (0 < s->alloc_size && s->str != (char *)0x0) {
        (*ctxt->free_fn)(s->str);
      }
      s->length = 0;
      s->alloc_size = 0;
      s->str = (char *)0x0;
      eVar1 = exr_attr_string_create_with_length(ctxt,s,d,len);
      return eVar1;
    }
    s->length = len;
    __dest = s->str;
    __n = (ulong)(uint)len;
    if (len != 0) {
      if (d == (char *)0x0) {
        memset(__dest,0,__n);
      }
      else {
        strncpy(__dest,d,__n);
      }
    }
    __dest[__n] = '\0';
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_set_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string argument to string set");

    if (len < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to assign a negative sized string (%d)",
            len);

    if (s->alloc_size > len)
    {
        /* we own the memory */
        char* sstr;

        s->length = len;
        sstr      = EXR_CONST_CAST (char*, s->str);
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#elif defined(__GNUC__)
#    pragma GCC diagnostic push
#    pragma GCC diagnostic ignored "-Wstringop-truncation"
#endif
            if (d)
                strncpy (sstr, d, (size_t) len);
            else
                memset (sstr, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#elif defined(__GNUC__)
#    pragma GCC diagnostic pop
#endif
        }
        sstr[len] = '\0';
        return EXR_ERR_SUCCESS;
    }
    exr_attr_string_destroy (ctxt, s);
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}